

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFactory.cpp
# Opt level: O1

Activation * __thiscall
PyreNet::ActivationFactory::getActivation(ActivationFactory *this,activationType activation)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  mapped_type pAVar3;
  Activation *pAVar4;
  mapped_type *ppAVar5;
  ulong uVar6;
  ActivationFactory *this_00;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lg;
  activationType activation_local;
  
  local_30 = (undefined1  [8])instanceMutex;
  lg._M_device._0_1_ = 0;
  lg._12_4_ = activation;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_30);
  lg._M_device._0_1_ = 1;
  this_00 = (ActivationFactory *)(this->activationCache)._M_h._M_buckets;
  uVar1 = (this->activationCache)._M_h._M_bucket_count;
  uVar6 = (ulong)(uint)lg._12_4_ % uVar1;
  p_Var7 = (__node_base_ptr)(&(this_00->activationCache)._M_h._M_buckets)[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var7->_M_nxt, p_Var8 = p_Var7, lg._12_4_ != *(int *)&p_Var7->_M_nxt[1]._M_nxt)) {
    while (p_Var7 = p_Var2, p_Var2 = p_Var7->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      this_00 = (ActivationFactory *)(ulong)*(uint *)&p_Var2[1]._M_nxt;
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)this_00 % uVar1 != uVar6) ||
         (p_Var8 = p_Var7, lg._12_4_ == *(uint *)&p_Var2[1]._M_nxt)) goto LAB_001073c8;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_001073c8:
  if ((p_Var8 == (__node_base_ptr)0x0) || (p_Var8->_M_nxt == (_Hash_node_base *)0x0)) {
    pAVar4 = generateActivation(this_00,lg._12_4_);
    ppAVar5 = std::__detail::
              _Map_base<PyreNet::LayerDefinition::activationType,_std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>,_std::__detail::_Select1st,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::hash<PyreNet::LayerDefinition::activationType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<PyreNet::LayerDefinition::activationType,_std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>,_std::__detail::_Select1st,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::hash<PyreNet::LayerDefinition::activationType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,(key_type *)&lg.field_0xc);
    *ppAVar5 = pAVar4;
  }
  ppAVar5 = std::__detail::
            _Map_base<PyreNet::LayerDefinition::activationType,_std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>,_std::__detail::_Select1st,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::hash<PyreNet::LayerDefinition::activationType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<PyreNet::LayerDefinition::activationType,_std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>,_std::__detail::_Select1st,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::hash<PyreNet::LayerDefinition::activationType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,(key_type *)&lg.field_0xc);
  pAVar3 = *ppAVar5;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return pAVar3;
}

Assistant:

Activation *ActivationFactory::getActivation(LayerDefinition::activationType activation) {
        std::unique_lock<std::mutex> lg(instanceMutex);
        if (this->activationCache.find(activation) == this->activationCache.end()) { // activation function not in cache
            this->activationCache[activation] = generateActivation(activation);
        }
        return this->activationCache[activation];
    }